

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32_t absl::lts_20240722::hash_internal::Mur(uint32_t a,uint32_t h)

{
  uint32_t uVar1;
  uint32_t h_local;
  uint32_t a_local;
  
  uVar1 = Rotate32(a * -0x3361d2af,0x11);
  uVar1 = Rotate32(uVar1 * 0x1b873593 ^ h,0x13);
  return uVar1 * 5 + 0xe6546b64;
}

Assistant:

static uint32_t Mur(uint32_t a, uint32_t h) {
  // Helper from Murmur3 for combining two 32-bit values.
  a *= c1;
  a = Rotate32(a, 17);
  a *= c2;
  h ^= a;
  h = Rotate32(h, 19);
  return h * 5 + 0xe6546b64;
}